

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O2

PatternView * __thiscall
ZXing::PatternView::subView
          (PatternView *__return_storage_ptr__,PatternView *this,int offset,int size)

{
  Iterator puVar1;
  int iVar2;
  
  if (size == 0) {
    size = this->_size - offset;
  }
  else if (size < 0) {
    size = (size - offset) + this->_size;
  }
  iVar2 = 0;
  if (0 < size) {
    iVar2 = size;
  }
  __return_storage_ptr__->_data = this->_data + offset;
  __return_storage_ptr__->_size = iVar2;
  puVar1 = this->_end;
  __return_storage_ptr__->_base = this->_base;
  __return_storage_ptr__->_end = puVar1;
  return __return_storage_ptr__;
}

Assistant:

PatternView subView(int offset, int size = 0) const
	{
//		if(std::abs(size) > count())
//			printf("%d > %d\n", std::abs(size), _count);
//		assert(std::abs(size) <= count());
		if (size == 0)
			size = _size - offset;
		else if (size < 0)
			size = _size - offset + size;
		return {begin() + offset, std::max(size, 0), _base, _end};
	}